

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O0

uint64_t aom_sum_sse_2d_i16_nxn_sse2(int16_t *src,int stride,int width,int height,int *sum)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  void *a;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  int *in_R8;
  int iVar25;
  uint uVar26;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  int iVar31;
  uint uVar32;
  int iVar33;
  uint uVar34;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar35;
  uint uVar36;
  __m128i v;
  __m128i v_sse_row_hi;
  __m128i v_sse_row_low;
  __m128i v_sum_0123_d;
  __m128i v_sum_23;
  __m128i v_sum_01;
  __m128i v_sq_0123_d;
  __m128i v_sq_23_d;
  __m128i v_sq_01_d;
  __m128i v_sq_3_d;
  __m128i v_sq_2_d;
  __m128i v_sq_1_d;
  __m128i v_sq_0_d;
  __m128i v_val_3_w;
  __m128i v_val_2_w;
  __m128i v_val_1_w;
  __m128i v_val_0_w;
  int16_t *b;
  __m128i v_sse_row;
  int c;
  __m128i v_sum_total;
  __m128i v_sse_total;
  __m128i one_reg;
  __m128i zero_reg;
  uint64_t result;
  int r;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_378;
  undefined8 uStack_370;
  int local_35c;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  long local_348;
  long lStack_340;
  uint64_t local_318;
  int local_30c;
  int *local_308;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  long local_2f0;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined2 local_1da;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short local_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  short sStack_180;
  short sStack_17e;
  short sStack_17c;
  short sStack_17a;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_d8;
  undefined8 uStack_d0;
  long local_c8;
  undefined8 uStack_c0;
  long local_b8;
  long lStack_b0;
  long local_a8;
  long lStack_a0;
  long local_98;
  long lStack_90;
  ulong local_88;
  ulong uStack_80;
  ulong local_78;
  ulong uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  local_2f4 = (int)in_RSI;
  local_30c = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_1da = 1;
  local_2 = 1;
  local_4 = 1;
  local_6 = 1;
  local_8 = 1;
  local_a = 1;
  local_c = 1;
  local_e = 1;
  local_10 = 1;
  uVar9 = 0x1000100010001;
  uVar10 = 0x1000100010001;
  local_348 = 0;
  lStack_340 = 0;
  local_358 = 0;
  iStack_354 = 0;
  iStack_350 = 0;
  iStack_34c = 0;
  local_308 = in_R8;
  local_2fc = in_ECX;
  local_2f8 = in_EDX;
  local_2f0 = in_RDI;
  uVar1 = local_68;
  uVar2 = uStack_60;
  uVar23 = local_48;
  uVar24 = uStack_40;
  local_28 = uVar9;
  uStack_20 = uVar10;
  do {
    uStack_40 = uVar24;
    local_48 = uVar23;
    uStack_60 = uVar2;
    local_68 = uVar1;
    local_35c = 0;
    local_378 = 0;
    uStack_370 = 0;
    do {
      a = (void *)(local_2f0 + (long)local_35c * 2);
      xx_load_128(a);
      xx_load_128((void *)((long)a + (long)local_2f4 * 2));
      xx_load_128((void *)((long)a + (long)(local_2f4 << 1) * 2));
      xx_load_128((void *)((long)a + (long)(local_2f4 * 3) * 2));
      auVar8._8_8_ = extraout_XMM0_Qb;
      auVar8._0_8_ = extraout_XMM0_Qa;
      auVar7._8_8_ = extraout_XMM0_Qb;
      auVar7._0_8_ = extraout_XMM0_Qa;
      auVar27 = pmaddwd(auVar8,auVar7);
      auVar6._8_8_ = extraout_XMM0_Qb_00;
      auVar6._0_8_ = extraout_XMM0_Qa_00;
      auVar5._8_8_ = extraout_XMM0_Qb_00;
      auVar5._0_8_ = extraout_XMM0_Qa_00;
      auVar28 = pmaddwd(auVar6,auVar5);
      auVar4._8_8_ = extraout_XMM0_Qb_01;
      auVar4._0_8_ = extraout_XMM0_Qa_01;
      auVar29._8_8_ = extraout_XMM0_Qb_01;
      auVar29._0_8_ = extraout_XMM0_Qa_01;
      auVar29 = pmaddwd(auVar4,auVar29);
      auVar3._8_8_ = extraout_XMM0_Qb_02;
      auVar3._0_8_ = extraout_XMM0_Qa_02;
      auVar30._8_8_ = extraout_XMM0_Qb_02;
      auVar30._0_8_ = extraout_XMM0_Qa_02;
      auVar30 = pmaddwd(auVar3,auVar30);
      local_3d8 = auVar27._0_8_;
      uStack_3d0 = auVar27._8_8_;
      local_3e8 = auVar28._0_8_;
      uStack_3e0 = auVar28._8_8_;
      local_218 = local_3d8;
      uVar21 = local_218;
      uStack_210 = uStack_3d0;
      uVar22 = uStack_210;
      local_228 = local_3e8;
      uVar19 = local_228;
      uStack_220 = uStack_3e0;
      uVar20 = uStack_220;
      local_218._0_4_ = auVar27._0_4_;
      local_218._4_4_ = auVar27._4_4_;
      uStack_210._0_4_ = auVar27._8_4_;
      uStack_210._4_4_ = auVar27._12_4_;
      local_228._0_4_ = auVar28._0_4_;
      local_228._4_4_ = auVar28._4_4_;
      uStack_220._0_4_ = auVar28._8_4_;
      uStack_220._4_4_ = auVar28._12_4_;
      local_3f8 = auVar29._0_8_;
      uStack_3f0 = auVar29._8_8_;
      local_408 = auVar30._0_8_;
      uStack_400 = auVar30._8_8_;
      local_238 = local_3f8;
      uVar17 = local_238;
      uStack_230 = uStack_3f0;
      uVar18 = uStack_230;
      local_248 = local_408;
      uVar15 = local_248;
      uStack_240 = uStack_400;
      uVar16 = uStack_240;
      local_238._0_4_ = auVar29._0_4_;
      local_238._4_4_ = auVar29._4_4_;
      uStack_230._0_4_ = auVar29._8_4_;
      uStack_230._4_4_ = auVar29._12_4_;
      local_248._0_4_ = auVar30._0_4_;
      local_248._4_4_ = auVar30._4_4_;
      uStack_240._0_4_ = auVar30._8_4_;
      uStack_240._4_4_ = auVar30._12_4_;
      local_258 = CONCAT44(local_218._4_4_ + local_228._4_4_,(int)local_218 + (int)local_228);
      uStack_250 = CONCAT44(uStack_210._4_4_ + uStack_220._4_4_,(int)uStack_210 + (int)uStack_220);
      local_268 = CONCAT44(local_238._4_4_ + local_248._4_4_,(int)local_238 + (int)local_248);
      uStack_260 = CONCAT44(uStack_230._4_4_ + uStack_240._4_4_,(int)uStack_230 + (int)uStack_240);
      iVar25 = (int)local_218 + (int)local_228 + (int)local_238 + (int)local_248;
      iVar31 = local_218._4_4_ + local_228._4_4_ + local_238._4_4_ + local_248._4_4_;
      iVar33 = (int)uStack_210 + (int)uStack_220 + (int)uStack_230 + (int)uStack_240;
      iVar35 = uStack_210._4_4_ + uStack_220._4_4_ + uStack_230._4_4_ + uStack_240._4_4_;
      uVar1 = local_378;
      uVar2 = uStack_370;
      local_288 = CONCAT44(iVar31,iVar25);
      uStack_280 = CONCAT44(iVar35,iVar33);
      local_278 = local_378;
      uVar13 = local_278;
      uStack_270 = uStack_370;
      uVar14 = uStack_270;
      local_278._0_4_ = (int)local_378;
      local_278._4_4_ = (int)((ulong)local_378 >> 0x20);
      uStack_270._0_4_ = (int)uStack_370;
      uStack_270._4_4_ = (int)((ulong)uStack_370 >> 0x20);
      uVar26 = (int)local_278 + iVar25;
      uVar32 = local_278._4_4_ + iVar31;
      uVar34 = (int)uStack_270 + iVar33;
      uVar36 = uStack_270._4_4_ + iVar35;
      local_378 = CONCAT44(uVar32,uVar26);
      uStack_370 = CONCAT44(uVar36,uVar34);
      local_188 = (short)extraout_XMM0_Qa;
      sStack_186 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
      sStack_184 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
      sStack_182 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
      sStack_180 = (short)extraout_XMM0_Qb;
      sStack_17e = (short)((ulong)extraout_XMM0_Qb >> 0x10);
      sStack_17c = (short)((ulong)extraout_XMM0_Qb >> 0x20);
      sStack_17a = (short)((ulong)extraout_XMM0_Qb >> 0x30);
      local_198 = (short)extraout_XMM0_Qa_00;
      sStack_196 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x10);
      sStack_194 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x20);
      sStack_192 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x30);
      sStack_190 = (short)extraout_XMM0_Qb_00;
      sStack_18e = (short)((ulong)extraout_XMM0_Qb_00 >> 0x10);
      sStack_18c = (short)((ulong)extraout_XMM0_Qb_00 >> 0x20);
      sStack_18a = (short)((ulong)extraout_XMM0_Qb_00 >> 0x30);
      local_1a8 = (short)extraout_XMM0_Qa_01;
      sStack_1a6 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x10);
      sStack_1a4 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x20);
      sStack_1a2 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x30);
      sStack_1a0 = (short)extraout_XMM0_Qb_01;
      sStack_19e = (short)((ulong)extraout_XMM0_Qb_01 >> 0x10);
      sStack_19c = (short)((ulong)extraout_XMM0_Qb_01 >> 0x20);
      sStack_19a = (short)((ulong)extraout_XMM0_Qb_01 >> 0x30);
      local_1b8 = (short)extraout_XMM0_Qa_02;
      sStack_1b6 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x10);
      sStack_1b4 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x20);
      sStack_1b2 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x30);
      sStack_1b0 = (short)extraout_XMM0_Qb_02;
      sStack_1ae = (short)((ulong)extraout_XMM0_Qb_02 >> 0x10);
      sStack_1ac = (short)((ulong)extraout_XMM0_Qb_02 >> 0x20);
      sStack_1aa = (short)((ulong)extraout_XMM0_Qb_02 >> 0x30);
      local_1c8 = CONCAT26(sStack_182 + sStack_192,
                           CONCAT24(sStack_184 + sStack_194,
                                    CONCAT22(sStack_186 + sStack_196,local_188 + local_198)));
      uStack_1c0 = CONCAT26(sStack_17a + sStack_18a,
                            CONCAT24(sStack_17c + sStack_18c,
                                     CONCAT22(sStack_17e + sStack_18e,sStack_180 + sStack_190)));
      local_1d8 = CONCAT26(sStack_1a2 + sStack_1b2,
                           CONCAT24(sStack_1a4 + sStack_1b4,
                                    CONCAT22(sStack_1a6 + sStack_1b6,local_1a8 + local_1b8)));
      uStack_1d0 = CONCAT26(sStack_19a + sStack_1aa,
                            CONCAT24(sStack_19c + sStack_1ac,
                                     CONCAT22(sStack_19e + sStack_1ae,sStack_1a0 + sStack_1b0)));
      local_468._0_4_ =
           CONCAT22(sStack_186 + sStack_196 + sStack_1a6 + sStack_1b6,
                    local_188 + local_198 + local_1a8 + local_1b8);
      local_468._0_6_ =
           CONCAT24(sStack_184 + sStack_194 + sStack_1a4 + sStack_1b4,(undefined4)local_468);
      local_468 = CONCAT26(sStack_182 + sStack_192 + sStack_1a2 + sStack_1b2,(undefined6)local_468);
      uStack_460._0_2_ = sStack_180 + sStack_190 + sStack_1a0 + sStack_1b0;
      uStack_460._2_2_ = sStack_17e + sStack_18e + sStack_19e + sStack_1ae;
      uStack_460._4_2_ = sStack_17c + sStack_18c + sStack_19c + sStack_1ac;
      uStack_460._6_2_ = sStack_17a + sStack_18a + sStack_19a + sStack_1aa;
      local_168 = local_468;
      uStack_160 = uStack_460;
      auVar28._8_8_ = uStack_460;
      auVar28._0_8_ = local_468;
      auVar27._8_8_ = 0x1000100010001;
      auVar27._0_8_ = 0x1000100010001;
      auVar27 = pmaddwd(auVar28,auVar27);
      local_298 = CONCAT44(iStack_354,local_358);
      uStack_290 = CONCAT44(iStack_34c,iStack_350);
      local_468 = auVar27._0_8_;
      uStack_460 = auVar27._8_8_;
      local_2a8 = local_468;
      uVar11 = local_2a8;
      uStack_2a0 = uStack_460;
      uVar12 = uStack_2a0;
      local_2a8._0_4_ = auVar27._0_4_;
      local_2a8._4_4_ = auVar27._4_4_;
      uStack_2a0._0_4_ = auVar27._8_4_;
      uStack_2a0._4_4_ = auVar27._12_4_;
      local_358 = local_358 + (int)local_2a8;
      iStack_354 = iStack_354 + local_2a8._4_4_;
      iStack_350 = iStack_350 + (int)uStack_2a0;
      iStack_34c = iStack_34c + uStack_2a0._4_4_;
      local_35c = local_35c + 8;
      local_2a8 = local_468;
      uStack_2a0 = uStack_460;
      local_278 = uVar1;
      uStack_270 = uVar2;
      local_248 = local_408;
      uStack_240 = uStack_400;
      local_238 = local_3f8;
      uStack_230 = uStack_3f0;
      local_228 = local_3e8;
      uStack_220 = uStack_3e0;
      local_218 = local_3d8;
      uStack_210 = uStack_3d0;
      local_178 = uVar9;
      uStack_170 = uVar10;
    } while (local_35c < local_2f8);
    local_58 = local_378;
    uStack_50 = uStack_370;
    local_68 = 0;
    uStack_60 = 0;
    local_38 = local_378;
    uStack_30 = uStack_370;
    local_48 = 0;
    uStack_40 = 0;
    local_78 = (ulong)uVar26;
    uStack_70 = (ulong)uVar32;
    local_88 = (ulong)uVar34;
    uStack_80 = (ulong)uVar36;
    local_a8 = local_78 + local_88;
    lStack_a0 = uStack_70 + uStack_80;
    local_98 = local_348;
    lStack_90 = lStack_340;
    local_348 = local_348 + local_a8;
    lStack_340 = lStack_340 + lStack_a0;
    local_2f0 = local_2f0 + (long)(local_2f4 << 2) * 2;
    local_30c = local_30c + 4;
    uVar1 = 0;
    uVar2 = 0;
    uVar23 = 0;
    uVar24 = 0;
  } while (local_30c < local_2fc);
  local_2b8 = CONCAT44(iStack_354,local_358);
  local_2c8 = CONCAT44(iStack_34c,iStack_350);
  uStack_2c0 = 0;
  iStack_354 = iStack_354 + iStack_34c;
  local_2d8._4_4_ = iStack_354;
  local_2d8._0_4_ = local_358 + iStack_350;
  local_2d8._8_4_ = iStack_350;
  local_2d8._12_4_ = iStack_34c;
  local_2e8 = local_2d8 >> 0x20;
  iVar25 = local_358 + iStack_350 + iStack_354;
  local_208 = CONCAT44(iStack_354 + iStack_350,iVar25);
  uStack_200 = CONCAT44(iStack_34c,iStack_350 + iStack_34c);
  *local_308 = *local_308 + iVar25;
  uStack_c0 = 0;
  v[1]._0_4_ = iVar25;
  v[0] = in_RSI;
  v[1]._4_4_ = 0;
  uStack_2b0 = local_2c8;
  local_2a8 = uVar11;
  uStack_2a0 = uVar12;
  local_278 = uVar13;
  uStack_270 = uVar14;
  local_248 = uVar15;
  uStack_240 = uVar16;
  local_238 = uVar17;
  uStack_230 = uVar18;
  local_228 = uVar19;
  uStack_220 = uVar20;
  local_218 = uVar21;
  uStack_210 = uVar22;
  local_1f8 = local_208;
  uStack_1f0 = uStack_200;
  local_c8 = lStack_340;
  local_b8 = local_348;
  lStack_b0 = lStack_340;
  xx_storel_64(&local_318,v);
  return local_318;
}

Assistant:

__attribute__((noinline))
#endif
uint64_t
aom_sum_sse_2d_i16_nxn_sse2(const int16_t *src, int stride, int width,
                            int height, int *sum) {
  int r = 0;
  uint64_t result;
  const __m128i zero_reg = _mm_setzero_si128();
  const __m128i one_reg = _mm_set1_epi16(1);

  __m128i v_sse_total = zero_reg;
  __m128i v_sum_total = zero_reg;

  do {
    int c = 0;
    __m128i v_sse_row = zero_reg;
    do {
      const int16_t *b = src + c;

      __m128i v_val_0_w = xx_load_128(b + 0 * stride);
      __m128i v_val_1_w = xx_load_128(b + 1 * stride);
      __m128i v_val_2_w = xx_load_128(b + 2 * stride);
      __m128i v_val_3_w = xx_load_128(b + 3 * stride);

      const __m128i v_sq_0_d = _mm_madd_epi16(v_val_0_w, v_val_0_w);
      const __m128i v_sq_1_d = _mm_madd_epi16(v_val_1_w, v_val_1_w);
      const __m128i v_sq_2_d = _mm_madd_epi16(v_val_2_w, v_val_2_w);
      const __m128i v_sq_3_d = _mm_madd_epi16(v_val_3_w, v_val_3_w);
      const __m128i v_sq_01_d = _mm_add_epi32(v_sq_0_d, v_sq_1_d);
      const __m128i v_sq_23_d = _mm_add_epi32(v_sq_2_d, v_sq_3_d);
      const __m128i v_sq_0123_d = _mm_add_epi32(v_sq_01_d, v_sq_23_d);
      v_sse_row = _mm_add_epi32(v_sse_row, v_sq_0123_d);

      const __m128i v_sum_01 = _mm_add_epi16(v_val_0_w, v_val_1_w);
      const __m128i v_sum_23 = _mm_add_epi16(v_val_2_w, v_val_3_w);
      __m128i v_sum_0123_d = _mm_add_epi16(v_sum_01, v_sum_23);
      v_sum_0123_d = _mm_madd_epi16(v_sum_0123_d, one_reg);
      v_sum_total = _mm_add_epi32(v_sum_total, v_sum_0123_d);

      c += 8;
    } while (c < width);

    const __m128i v_sse_row_low = _mm_unpacklo_epi32(v_sse_row, zero_reg);
    const __m128i v_sse_row_hi = _mm_unpackhi_epi32(v_sse_row, zero_reg);
    v_sse_row = _mm_add_epi64(v_sse_row_low, v_sse_row_hi);
    v_sse_total = _mm_add_epi64(v_sse_total, v_sse_row);
    src += 4 * stride;
    r += 4;
  } while (r < height);

  v_sum_total = _mm_add_epi32(v_sum_total, _mm_srli_si128(v_sum_total, 8));
  v_sum_total = _mm_add_epi32(v_sum_total, _mm_srli_si128(v_sum_total, 4));
  *sum += _mm_cvtsi128_si32(v_sum_total);

  v_sse_total = _mm_add_epi64(v_sse_total, _mm_srli_si128(v_sse_total, 8));
  xx_storel_64(&result, v_sse_total);
  return result;
}